

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_ex_c2i(ASN1_VALUE **pval,uchar *cont,int len,int utype,char *free_cont,ASN1_ITEM *it)

{
  uchar *puVar1;
  int iVar2;
  ASN1_OBJECT *pAVar3;
  ASN1_INTEGER *pAVar4;
  size_t sVar5;
  undefined4 in_register_00000014;
  size_t len_00;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t c_2;
  uint32_t c_1;
  uint32_t c;
  CBS cbs;
  ASN1_BOOLEAN *tbool;
  ASN1_INTEGER **tint;
  ASN1_TYPE *pAStack_48;
  int ret;
  ASN1_TYPE *typ;
  ASN1_STRING *stmp;
  ASN1_VALUE **opval;
  ASN1_ITEM *it_local;
  int utype_local;
  long len_local;
  uchar *cont_local;
  ASN1_VALUE **pval_local;
  
  len_00 = CONCAT44(in_register_00000014,len);
  stmp = (ASN1_STRING *)0x0;
  pAStack_48 = (ASN1_TYPE *)0x0;
  tint._4_4_ = 0;
  len_local = (long)cont;
  cont_local = (uchar *)pval;
  if (*(long *)(free_cont + 0x18) != 0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x2ef,
                  "int asn1_ex_c2i(ASN1_VALUE **, const unsigned char *, long, int, const ASN1_ITEM *)"
                 );
  }
  if (*(int *)(free_cont + 4) == -4) {
    if (*pval == (ASN1_VALUE *)0x0) {
      pAStack_48 = ASN1_TYPE_new();
      if (pAStack_48 == (ASN1_TYPE *)0x0) goto LAB_002cc666;
      *(ASN1_TYPE **)cont_local = pAStack_48;
    }
    else {
      pAStack_48 = (ASN1_TYPE *)*pval;
    }
    if (utype != pAStack_48->type) {
      ASN1_TYPE_set(pAStack_48,utype,(void *)0x0);
    }
    stmp = (ASN1_STRING *)cont_local;
    cont_local = (uchar *)&pAStack_48->value;
  }
  puVar1 = cont_local;
  switch(utype) {
  case 1:
    if (len_00 != 1) {
      ERR_put_error(0xc,0,0x6a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x318);
      goto LAB_002cc666;
    }
    cbs.len = (size_t)cont_local;
    *(uint *)cont_local = (uint)*(byte *)len_local;
    break;
  case 2:
  case 10:
    pAVar4 = c2i_ASN1_INTEGER((ASN1_INTEGER **)cont_local,(uchar **)&len_local,len_00);
    if (pAVar4 == (ASN1_INTEGER *)0x0) goto LAB_002cc666;
    *(uint *)(*(long *)puVar1 + 4) = utype | *(uint *)(*(long *)puVar1 + 4) & 0x100;
    break;
  case 3:
    pAVar3 = (ASN1_OBJECT *)
             c2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)cont_local,(uchar **)&len_local,len_00);
    goto joined_r0x002cc33f;
  case 5:
    if (len_00 != 0) {
      ERR_put_error(0xc,0,0xa4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x310);
      goto LAB_002cc666;
    }
    cont_local[0] = '\x01';
    cont_local[1] = '\0';
    cont_local[2] = '\0';
    cont_local[3] = '\0';
    cont_local[4] = '\0';
    cont_local[5] = '\0';
    cont_local[6] = '\0';
    cont_local[7] = '\0';
    break;
  case 6:
    pAVar3 = c2i_ASN1_OBJECT((ASN1_OBJECT **)cont_local,(uchar **)&len_local,len_00);
joined_r0x002cc33f:
    if (pAVar3 == (ASN1_OBJECT *)0x0) goto LAB_002cc666;
    break;
  case -3:
  case 4:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
    CBS_init((CBS *)&c_1,(uint8_t *)len_local,len_00);
    if (utype == 0x1e) {
      do {
        sVar5 = CBS_len((CBS *)&c_1);
        if (sVar5 == 0) goto LAB_002cc493;
        iVar2 = CBS_get_ucs2_be((CBS *)&c_1,&c_2);
      } while (iVar2 != 0);
      ERR_put_error(0xc,0,0x8e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x348);
      goto LAB_002cc666;
    }
LAB_002cc493:
    if (utype == 0x1c) {
      do {
        sVar5 = CBS_len((CBS *)&c_1);
        if (sVar5 == 0) goto LAB_002cc4e3;
        iVar2 = CBS_get_utf32_be((CBS *)&c_1,&local_78);
      } while (iVar2 != 0);
      ERR_put_error(0xc,0,0x95,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x351);
      goto LAB_002cc666;
    }
LAB_002cc4e3:
    if (utype == 0xc) {
      do {
        sVar5 = CBS_len((CBS *)&c_1);
        if (sVar5 == 0) goto LAB_002cc533;
        iVar2 = CBS_get_utf8((CBS *)&c_1,&local_7c);
      } while (iVar2 != 0);
      ERR_put_error(0xc,0,0x96,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x35a);
      goto LAB_002cc666;
    }
LAB_002cc533:
    if ((utype == 0x17) && (iVar2 = CBS_parse_utc_time((CBS *)&c_1,(tm *)0x0,1), iVar2 == 0)) {
      ERR_put_error(0xc,0,0x94,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x361);
      goto LAB_002cc666;
    }
    if ((utype == 0x18) && (iVar2 = CBS_parse_generalized_time((CBS *)&c_1,(tm *)0x0,0), iVar2 == 0)
       ) {
      ERR_put_error(0xc,0,0x94,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x368);
      goto LAB_002cc666;
    }
    if (*(long *)cont_local == 0) {
      typ = (ASN1_TYPE *)ASN1_STRING_type_new(utype);
      if ((ASN1_STRING *)typ == (ASN1_STRING *)0x0) goto LAB_002cc666;
      *(ASN1_TYPE **)cont_local = typ;
    }
    else {
      typ = *(ASN1_TYPE **)cont_local;
      *(int *)&typ->field_0x4 = utype;
    }
    iVar2 = ASN1_STRING_set((ASN1_STRING *)typ,(void *)len_local,len_00);
    if (iVar2 == 0) {
      ASN1_STRING_free((ASN1_STRING *)typ);
      cont_local[0] = '\0';
      cont_local[1] = '\0';
      cont_local[2] = '\0';
      cont_local[3] = '\0';
      cont_local[4] = '\0';
      cont_local[5] = '\0';
      cont_local[6] = '\0';
      cont_local[7] = '\0';
      goto LAB_002cc666;
    }
    break;
  default:
    ERR_put_error(0xc,0,0xc1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x382);
    goto LAB_002cc666;
  }
  if ((pAStack_48 != (ASN1_TYPE *)0x0) && (utype == 5)) {
    (pAStack_48->value).ptr = (char *)0x0;
  }
  tint._4_4_ = 1;
LAB_002cc666:
  if ((tint._4_4_ == 0) && (ASN1_TYPE_free(pAStack_48), stmp != (ASN1_STRING *)0x0)) {
    stmp->length = 0;
    stmp->type = 0;
  }
  return tint._4_4_;
}

Assistant:

static int asn1_ex_c2i(ASN1_VALUE **pval, const unsigned char *cont, long len,
                       int utype, const ASN1_ITEM *it) {
  ASN1_VALUE **opval = NULL;
  ASN1_STRING *stmp;
  ASN1_TYPE *typ = NULL;
  int ret = 0;
  ASN1_INTEGER **tint;

  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of callbacks.
  assert(it->funcs == NULL);

  // If ANY type clear type and set pointer to internal value
  if (it->utype == V_ASN1_ANY) {
    if (!*pval) {
      typ = ASN1_TYPE_new();
      if (typ == NULL) {
        goto err;
      }
      *pval = (ASN1_VALUE *)typ;
    } else {
      typ = (ASN1_TYPE *)*pval;
    }

    if (utype != typ->type) {
      ASN1_TYPE_set(typ, utype, NULL);
    }
    opval = pval;
    pval = &typ->value.asn1_value;
  }

  // If implementing a type that is not represented in |ASN1_STRING|, the
  // |V_ASN1_ANY_AS_STRING| logic must be modified to redirect it to
  // |V_ASN1_OTHER|.
  switch (utype) {
    case V_ASN1_OBJECT:
      if (!c2i_ASN1_OBJECT((ASN1_OBJECT **)pval, &cont, len)) {
        goto err;
      }
      break;

    case V_ASN1_NULL:
      if (len) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NULL_IS_WRONG_LENGTH);
        goto err;
      }
      *pval = (ASN1_VALUE *)1;
      break;

    case V_ASN1_BOOLEAN:
      if (len != 1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BOOLEAN_IS_WRONG_LENGTH);
        goto err;
      } else {
        ASN1_BOOLEAN *tbool;
        tbool = (ASN1_BOOLEAN *)pval;
        *tbool = *cont;
      }
      break;

    case V_ASN1_BIT_STRING:
      if (!c2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)pval, &cont, len)) {
        goto err;
      }
      break;

    case V_ASN1_INTEGER:
    case V_ASN1_ENUMERATED:
      tint = (ASN1_INTEGER **)pval;
      if (!c2i_ASN1_INTEGER(tint, &cont, len)) {
        goto err;
      }
      // Fixup type to match the expected form
      (*tint)->type = utype | ((*tint)->type & V_ASN1_NEG);
      break;

    case V_ASN1_OCTET_STRING:
    case V_ASN1_NUMERICSTRING:
    case V_ASN1_PRINTABLESTRING:
    case V_ASN1_T61STRING:
    case V_ASN1_VIDEOTEXSTRING:
    case V_ASN1_IA5STRING:
    case V_ASN1_UTCTIME:
    case V_ASN1_GENERALIZEDTIME:
    case V_ASN1_GRAPHICSTRING:
    case V_ASN1_VISIBLESTRING:
    case V_ASN1_GENERALSTRING:
    case V_ASN1_UNIVERSALSTRING:
    case V_ASN1_BMPSTRING:
    case V_ASN1_UTF8STRING:
    case V_ASN1_OTHER:
    case V_ASN1_SET:
    case V_ASN1_SEQUENCE: {
      CBS cbs;
      CBS_init(&cbs, cont, (size_t)len);
      if (utype == V_ASN1_BMPSTRING) {
        while (CBS_len(&cbs) != 0) {
          uint32_t c;
          if (!CBS_get_ucs2_be(&cbs, &c)) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_BMPSTRING);
            goto err;
          }
        }
      }
      if (utype == V_ASN1_UNIVERSALSTRING) {
        while (CBS_len(&cbs) != 0) {
          uint32_t c;
          if (!CBS_get_utf32_be(&cbs, &c)) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_UNIVERSALSTRING);
            goto err;
          }
        }
      }
      if (utype == V_ASN1_UTF8STRING) {
        while (CBS_len(&cbs) != 0) {
          uint32_t c;
          if (!CBS_get_utf8(&cbs, &c)) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_UTF8STRING);
            goto err;
          }
        }
      }
      if (utype == V_ASN1_UTCTIME) {
        if (!CBS_parse_utc_time(&cbs, NULL, /*allow_timezone_offset=*/1)) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_TIME_FORMAT);
          goto err;
        }
      }
      if (utype == V_ASN1_GENERALIZEDTIME) {
        if (!CBS_parse_generalized_time(&cbs, NULL,
                                        /*allow_timezone_offset=*/0)) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_TIME_FORMAT);
          goto err;
        }
      }
      // TODO(https://crbug.com/boringssl/427): Check other string types.

      // All based on ASN1_STRING and handled the same
      if (!*pval) {
        stmp = ASN1_STRING_type_new(utype);
        if (!stmp) {
          goto err;
        }
        *pval = (ASN1_VALUE *)stmp;
      } else {
        stmp = (ASN1_STRING *)*pval;
        stmp->type = utype;
      }
      if (!ASN1_STRING_set(stmp, cont, len)) {
        ASN1_STRING_free(stmp);
        *pval = NULL;
        goto err;
      }
      break;
    }

    default:
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      goto err;
  }
  // If ASN1_ANY and NULL type fix up value
  if (typ && (utype == V_ASN1_NULL)) {
    typ->value.ptr = NULL;
  }

  ret = 1;
err:
  if (!ret) {
    ASN1_TYPE_free(typ);
    if (opval) {
      *opval = NULL;
    }
  }
  return ret;
}